

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O0

void __thiscall CFriends::Init(CFriends *this)

{
  IConfigManager *pIVar1;
  IConsole *pIVar2;
  IInterface *in_RDI;
  IConsole *pConsole;
  IConfigManager *pConfigManager;
  
  IInterface::Kernel(in_RDI);
  pIVar1 = IKernel::RequestInterface<IConfigManager>((IKernel *)in_RDI);
  if (pIVar1 != (IConfigManager *)0x0) {
    (*(pIVar1->super_IInterface)._vptr_IInterface[7])(pIVar1,ConfigSaveCallback,in_RDI);
  }
  IInterface::Kernel(in_RDI);
  pIVar2 = IKernel::RequestInterface<IConsole>((IKernel *)in_RDI);
  if (pIVar2 != (IConsole *)0x0) {
    (*(pIVar2->super_IInterface)._vptr_IInterface[8])
              (pIVar2,"add_friend","s[name] s[clan]",2,ConAddFriend,in_RDI,"Add a friend");
    (*(pIVar2->super_IInterface)._vptr_IInterface[8])
              (pIVar2,"remove_friend","s[name] s[clan]",2,ConRemoveFriend,in_RDI,"Remove a friend");
  }
  return;
}

Assistant:

void CFriends::Init()
{
	IConfigManager *pConfigManager = Kernel()->RequestInterface<IConfigManager>();
	if(pConfigManager)
		pConfigManager->RegisterCallback(ConfigSaveCallback, this);

	IConsole *pConsole = Kernel()->RequestInterface<IConsole>();
	if(pConsole)
	{
		pConsole->Register("add_friend", "s[name] s[clan]", CFGFLAG_CLIENT, ConAddFriend, this, "Add a friend");
		pConsole->Register("remove_friend", "s[name] s[clan]", CFGFLAG_CLIENT, ConRemoveFriend, this, "Remove a friend");
	}
}